

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O2

void __thiscall
Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::gemm_blocking_space
          (gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *this,Index rows,Index cols,
          Index depth,Index num_threads,bool l3_blocking)

{
  long lVar1;
  Index *n_00;
  undefined3 in_register_00000089;
  Index n;
  Index local_10;
  
  (this->super_level3_blocking<double,_double>).m_blockA = (LhsScalar *)0x0;
  (this->super_level3_blocking<double,_double>).m_blockB = (RhsScalar *)0x0;
  (this->super_level3_blocking<double,_double>).m_mc = rows;
  (this->super_level3_blocking<double,_double>).m_nc = cols;
  (this->super_level3_blocking<double,_double>).m_kc = depth;
  if (CONCAT31(in_register_00000089,l3_blocking) == 0) {
    n_00 = &local_10;
    local_10 = cols;
  }
  else {
    n_00 = &(this->super_level3_blocking<double,_double>).m_nc;
  }
  evaluateProductBlockingSizesHeuristic<double,double,1,long>
            (&(this->super_level3_blocking<double,_double>).m_kc,
             &(this->super_level3_blocking<double,_double>).m_mc,n_00,num_threads);
  lVar1 = (this->super_level3_blocking<double,_double>).m_kc;
  this->m_sizeA = (this->super_level3_blocking<double,_double>).m_mc * lVar1;
  this->m_sizeB = lVar1 * (this->super_level3_blocking<double,_double>).m_nc;
  return;
}

Assistant:

gemm_blocking_space(Index rows, Index cols, Index depth, Index num_threads, bool l3_blocking)
    {
      this->m_mc = Transpose ? cols : rows;
      this->m_nc = Transpose ? rows : cols;
      this->m_kc = depth;

      if(l3_blocking)
      {
        computeProductBlockingSizes<LhsScalar,RhsScalar,KcFactor>(this->m_kc, this->m_mc, this->m_nc, num_threads);
      }
      else  // no l3 blocking
      {
        Index n = this->m_nc;
        computeProductBlockingSizes<LhsScalar,RhsScalar,KcFactor>(this->m_kc, this->m_mc, n, num_threads);
      }

      m_sizeA = this->m_mc * this->m_kc;
      m_sizeB = this->m_kc * this->m_nc;
    }